

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::evaluateStart(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  CAddr CVar1;
  uint sourceSize;
  uint Source;
  Cell i;
  int iVar2;
  
  requireDStackDepth(this,2,"EVALUATE");
  SaveInput(this);
  this_00 = &this->dStack;
  sourceSize = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  Source = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  this->sourceid = 0xffffffff;
  CVar1 = this->VarOffsetBlkAddress;
  iVar2 = 0;
  do {
    dataSpaceSet(this,CVar1 + iVar2,'\0');
    iVar2 = iVar2 + 1;
  } while (iVar2 != 4);
  setSourceVariables(this,Source,sourceSize,0);
  this->InterpretState = InterpretSource;
  return;
}

Assistant:

void evaluateStart() {
			REQUIRE_DSTACK_DEPTH(2, "EVALUATE");
			SaveInput();
			auto length = dStack.getTop(); dStack.pop();
			auto caddr = CADDR(dStack.getTop()); dStack.pop();
			setSourceId(-1);
			setDataCell(VarOffsetBlkAddress, Cell(0)); // set BLK=0
			setSourceVariables(caddr, length, 0);
			InterpretState = InterpretSource;
		}